

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

bool RestoreParentTypeScope(ExpressionContext *ctx,SynBase *source,TypeBase *parentType)

{
  ScopeData *pSVar1;
  TypeBase *pTVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeGenericAlias *pTVar6;
  undefined4 extraout_var_01;
  bool bVar7;
  long *plVar8;
  TypeRef *pTVar9;
  long lVar10;
  SynIdentifier *pSVar11;
  AliasData *pAVar5;
  
  if ((parentType == (TypeBase *)0x0) || (ctx->scope->ownerType == parentType)) {
    bVar7 = false;
  }
  else {
    ExpressionContext::PushScope(ctx,parentType);
    if (parentType->typeID == 0x18) {
      for (plVar8 = (long *)parentType[2].size; plVar8 != (long *)0x0; plVar8 = (long *)plVar8[2]) {
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pAVar5 = (AliasData *)CONCAT44(extraout_var,iVar3);
        pSVar1 = ctx->scope;
        pSVar11 = (SynIdentifier *)*plVar8;
        pTVar2 = (TypeBase *)plVar8[1];
        uVar4 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar4 + 1;
        pAVar5->source = source;
        pAVar5->scope = pSVar1;
        pAVar5->type = pTVar2;
        pAVar5->name = pSVar11;
        pAVar5->uniqueId = uVar4;
        pAVar5->importModule = (ModuleData *)0x0;
        uVar4 = NULLC::GetStringHash((pSVar11->name).begin,(pSVar11->name).end);
        pAVar5->nameHash = uVar4;
        ExpressionContext::AddAlias(ctx,pAVar5);
      }
      for (pTVar9 = parentType[2].refType; pTVar9 != (TypeRef *)0x0;
          pTVar9 = (TypeRef *)(pTVar9->super_TypeBase).name.begin) {
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pAVar5 = (AliasData *)CONCAT44(extraout_var_01,iVar3);
        pSVar1 = ctx->scope;
        pSVar11 = (SynIdentifier *)(pTVar9->super_TypeBase)._vptr_TypeBase;
        pTVar2 = *(TypeBase **)&(pTVar9->super_TypeBase).typeID;
        uVar4 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar4 + 1;
        pAVar5->source = source;
        pAVar5->scope = pSVar1;
        pAVar5->type = pTVar2;
        pAVar5->name = pSVar11;
        pAVar5->uniqueId = uVar4;
        pAVar5->importModule = (ModuleData *)0x0;
        uVar4 = NULLC::GetStringHash((pSVar11->name).begin,(pSVar11->name).end);
        pAVar5->nameHash = uVar4;
        ExpressionContext::AddAlias(ctx,pAVar5);
      }
      lVar10._0_4_ = parentType[1].typeID;
      lVar10._4_4_ = parentType[1].nameHash;
      bVar7 = true;
      for (; lVar10 != 0; lVar10 = *(long *)(lVar10 + 0x18)) {
        ExpressionContext::AddVariable(ctx,*(VariableData **)(lVar10 + 8),true);
      }
    }
    else {
      bVar7 = true;
      if (parentType->typeID == 0x16) {
        pSVar11 = (SynIdentifier *)parentType[2]._vptr_TypeBase[10];
        while (pSVar11 != (SynIdentifier *)0x0) {
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
          pAVar5 = (AliasData *)CONCAT44(extraout_var_00,iVar3);
          pSVar1 = ctx->scope;
          pTVar6 = ExpressionContext::GetGenericAliasType(ctx,pSVar11);
          uVar4 = ctx->uniqueAliasId;
          ctx->uniqueAliasId = uVar4 + 1;
          pAVar5->source = source;
          pAVar5->scope = pSVar1;
          pAVar5->type = &pTVar6->super_TypeBase;
          pAVar5->name = pSVar11;
          pAVar5->uniqueId = uVar4;
          pAVar5->importModule = (ModuleData *)0x0;
          uVar4 = NULLC::GetStringHash((pSVar11->name).begin,(pSVar11->name).end);
          pAVar5->nameHash = uVar4;
          ExpressionContext::AddAlias(ctx,pAVar5);
          pSVar11 = (SynIdentifier *)(pSVar11->super_SynBase).next;
          if ((pSVar11 == (SynIdentifier *)0x0) || ((pSVar11->super_SynBase).typeID != 4)) {
            pSVar11 = (SynIdentifier *)0x0;
          }
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool RestoreParentTypeScope(ExpressionContext &ctx, SynBase *source, TypeBase *parentType)
{
	if(parentType && ctx.scope->ownerType != parentType)
	{
		ctx.PushScope(parentType);

		if(TypeClass *classType = getType<TypeClass>(parentType))
		{
			for(MatchData *el = classType->generics.head; el; el = el->next)
				ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

			for(MatchData *el = classType->aliases.head; el; el = el->next)
				ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

			for(MemberHandle *el = classType->members.head; el; el = el->next)
				ctx.AddVariable(el->variable, true);
		}
		else if(TypeGenericClassProto *genericProto = getType<TypeGenericClassProto>(parentType))
		{
			SynClassDefinition *definition = genericProto->definition;

			for(SynIdentifier *curr = definition->aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
				ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, ctx.GetGenericAliasType(curr), curr, ctx.uniqueAliasId++));
		}

		return true;
	}

	return false;
}